

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Instance>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *vk;
  VkApplicationInfo appInfo;
  Move<vk::VkInstance_s_*> local_a0;
  VkInstanceCreateInfo local_88;
  VkApplicationInfo local_48;
  
  vk = context->m_platformInterface;
  Context::getDeviceInterface(context);
  Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  local_88.pApplicationInfo = &local_48;
  local_48.pEngineName = (char *)0x0;
  local_48.pApplicationName = (char *)0x0;
  local_48.applicationVersion = 0;
  local_48._28_4_ = 0;
  local_48.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_48._4_4_ = 0;
  local_48.pNext = (void *)0x0;
  local_48.engineVersion = 0;
  local_48.apiVersion = 0x400000;
  local_88.pNext = (void *)0x0;
  local_88._16_8_ = 0;
  local_88.enabledExtensionCount = 0;
  local_88._52_4_ = 0;
  local_88.ppEnabledExtensionNames = (char **)0x0;
  local_88.enabledLayerCount = 0;
  local_88._36_4_ = 0;
  local_88.ppEnabledLayerNames = (char **)0x0;
  local_88.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_88._4_4_ = 0;
  ::vk::createInstance(&local_a0,vk,&local_88,(VkAllocationCallbacks *)0x0);
  if (local_a0.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
    (*local_a0.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_a0.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_a0.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  }
  local_88._0_8_ = (void *)((long)&local_88 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_88._0_8_,
             (long)local_88.pNext + local_88._0_8_);
  if ((void *)local_88._0_8_ != (void *)((long)&local_88 + 0x10U)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}